

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FunctionExecutionStateMachine.cpp
# Opt level: O2

ExecutionMode __thiscall
Js::FunctionExecutionStateMachine::GetInterpreterExecutionMode
          (FunctionExecutionStateMachine *this,bool isPostBailout)

{
  code *pcVar1;
  bool bVar2;
  ExecutionMode EVar3;
  ExecutionState state;
  undefined4 *puVar4;
  
  if (this->initializedExecutionModeAndLimits == false) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar4 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Base/FunctionExecutionStateMachine.cpp"
                                ,0x10c,"(initializedExecutionModeAndLimits)",
                                "initializedExecutionModeAndLimits");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    *puVar4 = 0;
  }
  if ((isPostBailout) && (bVar2 = FunctionBody::DoInterpreterProfile((this->owner).ptr), bVar2)) {
    return ProfilingInterpreter;
  }
  EVar3 = GetExecutionMode(this);
  if (EVar3 < SimpleJit) {
    EVar3 = GetExecutionMode(this);
    return EVar3;
  }
  if ((EVar3 == SimpleJit) && (DAT_01441e6c == '\x01')) {
    state = GetDefaultInterpreterExecutionState(this);
    EVar3 = StateToMode(this,state);
    return EVar3;
  }
  bVar2 = FunctionBody::DoInterpreterProfile((this->owner).ptr);
  VerifyExecutionMode(this,bVar2 * '\x02');
  return bVar2 * '\x02';
}

Assistant:

ExecutionMode FunctionExecutionStateMachine::GetInterpreterExecutionMode(const bool isPostBailout)
    {
        Assert(initializedExecutionModeAndLimits);

        if (isPostBailout && owner->DoInterpreterProfile())
        {
            return ExecutionMode::ProfilingInterpreter;
        }

        switch (GetExecutionMode())
        {
        case ExecutionMode::Interpreter:
        case ExecutionMode::AutoProfilingInterpreter:
        case ExecutionMode::ProfilingInterpreter:
            return GetExecutionMode();

        case ExecutionMode::SimpleJit:
            if (CONFIG_FLAG(NewSimpleJit))
            {
                return StateToMode(GetDefaultInterpreterExecutionState());
            }
            // fall through

        case ExecutionMode::FullJit:
        {
            const ExecutionMode executionMode =
                owner->DoInterpreterProfile() ? ExecutionMode::ProfilingInterpreter : ExecutionMode::Interpreter;
            VerifyExecutionMode(executionMode);
            return executionMode;
        }

        default:
            Assert(false);
            __assume(false);
        }
    }